

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmp-tracking-gain-estimator.cpp
# Opt level: O0

void __thiscall
stateObservation::ZmpTrackingGainEstimator::resetWithMeasurements
          (ZmpTrackingGainEstimator *this,Vector2 *initZMP,Vector3 *initGain,Matrix2 *yaw,
          Vector2 *initZMPUncertainty,Vector3 *initGainUncertainty)

{
  Matrix<double,_1,1,0,_1,1> *this_00;
  CommaInitializer<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *pCVar1;
  Matrix<double,__1,__1,_0,__1,__1> local_238;
  Matrix3 local_220;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>
  local_1d8 [16];
  ConstTransposeReturnType local_1c8;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>
  local_1b8 [16];
  DenseBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> local_1a8 [32];
  CommaInitializer<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> local_188;
  DenseBase<Eigen::Matrix<double,5,5,0,5,5>> local_168 [8];
  Matrix5 P;
  CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> local_80;
  DenseBase<Eigen::Matrix<double,5,1,0,5,1>> local_60 [8];
  Vector5 x;
  Vector3 *initGainUncertainty_local;
  Vector2 *initZMPUncertainty_local;
  Matrix2 *yaw_local;
  Vector3 *initGain_local;
  Vector2 *initZMP_local;
  ZmpTrackingGainEstimator *this_local;
  
  x.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.array[4] =
       (double)initGainUncertainty;
  KalmanFilterBase::reset(&(this->filter_).super_KalmanFilterBase);
  updateQ_(this);
  updateR_(this);
  Eigen::Matrix<double,_5,_1,_0,_5,_1>::Matrix((Matrix<double,_5,_1,_0,_5,_1> *)local_60);
  Eigen::DenseBase<Eigen::Matrix<double,5,1,0,5,1>>::operator<<
            (&local_80,local_60,(DenseBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)initZMP);
  Eigen::CommaInitializer<Eigen::Matrix<double,5,1,0,5,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,5,1,0,5,1>> *)&local_80,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)initGain);
  Eigen::CommaInitializer<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>::~CommaInitializer(&local_80);
  this_00 = (Matrix<double,_1,1,0,_1,1> *)
            (P.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array +
            0x18);
  Eigen::Matrix<double,-1,1,0,-1,1>::Matrix<Eigen::Matrix<double,5,1,0,5,1>>
            (this_00,(EigenBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_> *)local_60);
  ZeroDelayObserver::setState((ZeroDelayObserver *)&this->filter_,(StateVector *)this_00,0);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             (P.super_PlainObjectBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>.m_storage.m_data.array
             + 0x18));
  Eigen::Matrix<double,_2,_2,_0,_2,_2>::operator=(&this->yaw_,yaw);
  Eigen::Matrix<double,_5,_5,_0,_5,_5>::Matrix((Matrix<double,_5,_5,_0,_5,_5> *)local_168);
  Vec2ToSqDiag_((Matrix2 *)local_1a8,initZMPUncertainty);
  Eigen::DenseBase<Eigen::Matrix<double,5,5,0,5,5>>::operator<<(&local_188,local_168,local_1a8);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::Zero();
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>> *)&local_188,local_1b8);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_0,_2,_3>_>::Zero();
  Eigen::
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>
  ::transpose(&local_1c8,local_1d8);
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>> *)pCVar1,
                      (DenseBase<Eigen::Transpose<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_2,_3,_0,_2,_3>_>_>_>
                       *)&local_1c8);
  Vec3ToSqDiag_(&local_220,
                (Vector3 *)
                x.super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.m_data.
                array[4]);
  Eigen::CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,5,5,0,5,5>> *)pCVar1,
             (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_220);
  Eigen::CommaInitializer<Eigen::Matrix<double,_5,_5,_0,_5,_5>_>::~CommaInitializer(&local_188);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<Eigen::Matrix<double,5,5,0,5,5>>
            ((Matrix<double,_1,_1,0,_1,_1> *)&local_238,
             (EigenBase<Eigen::Matrix<double,_5,_5,_0,_5,_5>_> *)local_168);
  KalmanFilterBase::setStateCovariance
            (&(this->filter_).super_KalmanFilterBase,(Pmatrix *)&local_238);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_238);
  return;
}

Assistant:

void ZmpTrackingGainEstimator::resetWithMeasurements(const Vector2 & initZMP,
                                                     const Vector3 & initGain,
                                                     const Matrix2 & yaw,
                                                     const Vector2 & initZMPUncertainty,
                                                     const Vector3 & initGainUncertainty)
{
  filter_.reset();
  updateQ_();
  updateR_();

  Vector5 x;
  x << initZMP, initGain;
  filter_.setState(x, 0);

  yaw_ = yaw;

  Matrix5 P;
  // clang-format off
  P << Vec2ToSqDiag_(initZMPUncertainty),  Matrix23::Zero(), 
       Matrix23::Zero().transpose(),       Vec3ToSqDiag_(initGainUncertainty);
  // clang-format on
  filter_.setStateCovariance(P);
}